

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_8f1b29::SourceLineSynchronizer::syncToLine
          (SourceLineSynchronizer *this,int tokenLine)

{
  int iVar1;
  bool newLineStarted;
  int tokenLine_local;
  SourceLineSynchronizer *this_local;
  
  syncToMostRecentString(this);
  iVar1 = this->lastLine;
  while (this->lastLine < tokenLine) {
    if (0 < this->lastLine) {
      std::__cxx11::string::operator+=((string *)this->output,'\n');
    }
    this->lastLine = this->lastLine + 1;
  }
  return iVar1 < tokenLine;
}

Assistant:

bool syncToLine(int tokenLine) {
        syncToMostRecentString();
        const bool newLineStarted = lastLine < tokenLine;
        for (; lastLine < tokenLine; ++lastLine) {
            if (lastLine > 0) *output += '\n';
        }
        return newLineStarted;
    }